

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit
          (BinBinaryReader *this,Pointer *value)

{
  char *pcVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  char *pcVar5;
  size_t in_RCX;
  FNV1a *__nbytes;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  char *start_6;
  char *start_5;
  char *start_4;
  char *start_3;
  reference pvStack_58;
  Type type;
  FNV1a *name;
  size_t i;
  char *start_2;
  size_t position;
  char *start_1;
  char *start;
  uint16_t count;
  Pointer *pPStack_20;
  uint32_t size;
  Pointer *value_local;
  BinBinaryReader *this_local;
  
  start._4_4_ = 0;
  start._2_2_ = 0;
  start_1 = (this->reader).cur_;
  pPStack_20 = value;
  value_local = (Pointer *)this;
  uVar4 = BinaryReader::read(&this->reader,(int)value,in_RDX,in_RCX);
  if ((uVar4 & 1) == 0) {
    this_local._7_1_ = fail_msg(this,"reader.read(value.name)",start_1);
  }
  else {
    uVar3 = FNV1a::hash(&pPStack_20->name);
    if (uVar3 == 0) {
      this_local._7_1_ = true;
    }
    else {
      position = (size_t)(this->reader).cur_;
      bVar2 = BinaryReader::read<unsigned_int>(&this->reader,(uint *)((long)&start + 4));
      if (bVar2) {
        start_2 = (char *)BinaryReader::position(&this->reader);
        i = (size_t)(this->reader).cur_;
        bVar2 = BinaryReader::read<unsigned_short>
                          (&this->reader,(unsigned_short *)((long)&start + 2));
        if (bVar2) {
          for (name = (FNV1a *)0x0; __nbytes = (FNV1a *)(ulong)start._2_2_, name != __nbytes;
              name = (FNV1a *)((long)&name->hash_ + 1)) {
            pvStack_58 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::
                         emplace_back<>(&pPStack_20->items);
            start_3._7_1_ = NONE;
            pcVar1 = (this->reader).cur_;
            uVar4 = BinaryReader::read(&this->reader,(int)pvStack_58,__buf,(size_t)__nbytes);
            if ((uVar4 & 1) == 0) {
              bVar2 = fail_msg(this,"reader.read(name)",pcVar1);
              return bVar2;
            }
            pcVar1 = (this->reader).cur_;
            uVar4 = BinaryReader::read(&this->reader,(int)&start_3 + 7,__buf_00,(size_t)__nbytes);
            if ((uVar4 & 1) == 0) {
              bVar2 = fail_msg(this,"reader.read(type)",pcVar1);
              return bVar2;
            }
            pcVar1 = (this->reader).cur_;
            bVar2 = read_value_of(this,&pvStack_58->value,start_3._7_1_);
            if (!bVar2) {
              bVar2 = fail_msg(this,"read_value_of(item, type)",pcVar1);
              return bVar2;
            }
          }
          pcVar1 = (this->reader).cur_;
          pcVar5 = (char *)BinaryReader::position(&this->reader);
          if (pcVar5 == start_2 + start._4_4_) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = fail_msg(this,"reader.position() == position + size",pcVar1);
          }
        }
        else {
          this_local._7_1_ = fail_msg(this,"reader.read(count)",(char *)i);
        }
      }
      else {
        this_local._7_1_ = fail_msg(this,"reader.read(size)",(char *)position);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool read_value_visit(Pointer& value) noexcept {
            uint32_t size = 0;
            uint16_t count = 0;
            bin_assert(reader.read(value.name));
            if (value.name.hash() == 0) {
                return true;
            }
            bin_assert(reader.read(size));
            size_t position = reader.position();
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [name, item] = value.items.emplace_back();
                Type type = {};
                bin_assert(reader.read(name));
                bin_assert(reader.read(type));
                bin_assert(read_value_of(item, type));
            }
            bin_assert(reader.position() == position + size);
            return true;
        }